

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void google::protobuf::compiler::cpp::
     ForEachField<true,google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
               (Descriptor *d,anon_class_16_2_3fe543fb *func)

{
  long lVar1;
  long lVar2;
  
  if (0 < d->nested_type_count_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      ForEachField<true,google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
                ((Descriptor *)(&d->nested_types_->super_SymbolBase + lVar2),func);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0xa0;
    } while (lVar1 < d->nested_type_count_);
  }
  if (0 < d->extension_count_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      FileGenerator::GetCrossFileReferencesForField
                (func->this,(FieldDescriptor *)(&d->extensions_->super_SymbolBase + lVar2),
                 func->refs);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x58;
    } while (lVar1 < d->extension_count_);
  }
  if (0 < d->field_count_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      FileGenerator::GetCrossFileReferencesForField
                (func->this,(FieldDescriptor *)(&d->fields_->super_SymbolBase + lVar2),func->refs);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x58;
    } while (lVar1 < d->field_count_);
  }
  return;
}

Assistant:

void ForEachField(const Descriptor* d, T&& func) {
  if (do_nested_types) {
    for (int i = 0; i < d->nested_type_count(); i++) {
      ForEachField<true>(d->nested_type(i), std::forward<T&&>(func));
    }
  }
  for (int i = 0; i < d->extension_count(); i++) {
    func(d->extension(i));
  }
  for (int i = 0; i < d->field_count(); i++) {
    func(d->field(i));
  }
}